

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

CVmTimeZone * __thiscall CVmTimeZoneCache::tz_from_hash(CVmTimeZoneCache *this,ZoneHashEntry *entry)

{
  long lVar1;
  CVmTimeZone *pCVar2;
  long *in_RSI;
  long in_RDI;
  ZoneHashEntry *in_stack_00000068;
  undefined8 local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (CVmTimeZone *)0x0;
  }
  else {
    lVar1 = (**(code **)(*in_RSI + 0x18))();
    if (*(long *)(lVar1 + 0x28) == 0) {
      pCVar2 = CVmTimeZone::load(in_stack_00000068);
      *(CVmTimeZone **)(lVar1 + 0x28) = pCVar2;
      if (*(long *)(lVar1 + 0x28) != 0) {
        *(undefined8 *)(lVar1 + 0x38) = *(undefined8 *)(in_RDI + 0x30);
        *(long *)(in_RDI + 0x30) = lVar1;
      }
    }
    local_8 = *(CVmTimeZone **)(lVar1 + 0x28);
  }
  return local_8;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::tz_from_hash(VMG_ ZoneHashEntry *entry)
{
    /* if there's no table entry, there's nothing to load */
    if (entry == 0)
        return 0;

    /* resolve links */
    entry = entry->resolve_links();

    /* if we haven't loaded the timezone object yet, do so now */
    if (entry->tz == 0)
    {
        /* load it */
        entry->tz = CVmTimeZone::load(vmg_ entry);

        /* if successful, add it to the loaded zone list */
        if (entry->tz != 0)
        {
            entry->nxt = first_loaded_;
            first_loaded_ = entry;
        }
    }

    /* return the cached object */
    return entry->tz;
}